

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O2

void __thiscall libtorrent::tracker_alert::~tracker_alert(tracker_alert *this)

{
  (this->super_torrent_alert).super_alert._vptr_alert = (_func_int **)&PTR__tracker_alert_00430708;
  std::__cxx11::string::~string((string *)&this->url);
  torrent_alert::~torrent_alert(&this->super_torrent_alert);
  return;
}

Assistant:

struct TORRENT_EXPORT tracker_alert : torrent_alert
	{
		// internal
		tracker_alert(aux::stack_allocator& alloc, torrent_handle const& h
			, tcp::endpoint const& ep, string_view u);

#if TORRENT_ABI_VERSION == 1
		static const int TORRENT_DEPRECATED_MEMBER alert_type = 2;
#endif

		std::string message() const override;

		// endpoint of the listen interface being announced
		aux::noexcept_movable<tcp::endpoint> local_endpoint;

		// returns a 0-terminated string of the tracker's URL
		char const* tracker_url() const;

	private:
		aux::allocation_slot m_url_idx;
#if TORRENT_ABI_VERSION == 1
	public:
		// The tracker URL
		std::string TORRENT_DEPRECATED_MEMBER url;
#endif
	}